

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O2

void printDifference<float>
               (Serializer *serializer1,Serializer *serializer2,Savepoint *savepoint,
               DataFieldInfo *info1,DataFieldInfo *info2,IJKLBounds *bounds,
               vector<bool,_std::allocator<bool>_> *failed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  const_reference cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  size_type __n;
  int iVar20;
  int iVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  float *data2;
  float *data1;
  undefined1 local_58 [24];
  ulong local_40;
  long local_38;
  
  readData<float>(serializer1,info1,savepoint,&data1);
  readData<float>(serializer2,info2,savepoint,&data2);
  iVar1 = info1->jSize_;
  iVar2 = info1->kSize_;
  iVar3 = info1->lSize_;
  iVar4 = bounds->iLower;
  iVar13 = bounds->iUpper;
  iVar21 = iVar13 + 1;
  iVar18 = bounds->jUpper;
  iVar6 = iVar18 - bounds->jLower;
  iVar10 = bounds->kUpper;
  iVar7 = iVar10 - bounds->kLower;
  iVar8 = bounds->lUpper;
  iVar15 = iVar8 - bounds->lLower;
  iVar16 = iVar1 * iVar4;
  local_58._0_16_ = ZEXT816(0);
  iVar20 = 0;
  iVar12 = 0;
  for (iVar19 = iVar4; iVar19 <= iVar13; iVar19 = iVar19 + 1) {
    uVar17 = bounds->jLower;
    iVar13 = (iVar16 + uVar17) * iVar2;
    while ((int)uVar17 <= iVar18) {
      iVar18 = (bounds->kLower + iVar13) * iVar3;
      lVar14 = (long)bounds->kLower;
      local_40 = (ulong)uVar17;
      while (lVar14 <= iVar10) {
        lVar11 = (long)bounds->lLower;
        __n = iVar18 + lVar11;
        local_38 = lVar14;
        for (; lVar11 <= iVar8; lVar11 = lVar11 + 1) {
          cVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](failed,__n);
          if (cVar5) {
            iVar12 = iVar12 + 1;
            dVar24 = (double)data2[__n];
            iVar20 = iVar20 + (uint)(NAN(data1[__n]) || NAN(data2[__n]));
            dVar22 = (double)data1[__n] - dVar24;
            auVar23._0_8_ = ABS(dVar22);
            auVar23._8_8_ = ABS(dVar22 / dVar24);
            local_58._0_16_ = maxpd(auVar23,local_58._0_16_);
          }
          iVar8 = bounds->lUpper;
          __n = __n + 1;
        }
        iVar10 = bounds->kUpper;
        iVar18 = iVar18 + iVar3;
        lVar14 = local_38 + 1;
      }
      iVar18 = bounds->jUpper;
      iVar13 = iVar13 + iVar2;
      uVar17 = (int)local_40 + 1;
    }
    iVar13 = bounds->iUpper;
    iVar16 = iVar16 + iVar1;
  }
  iVar21 = (iVar7 + 1) * (iVar15 + 1) * (iVar6 + 1) * (iVar21 - iVar4);
  poVar9 = std::operator<<((ostream *)&std::cout," | Number of values: ");
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 6;
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar21);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout," | Number of errors: ");
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 6;
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
  std::operator<<(poVar9,"\n");
  if (iVar20 != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout," | Number of NaN errors: ");
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 6;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::operator<<(poVar9,"\n");
  }
  poVar9 = std::operator<<((ostream *)&std::cout," | Percentuage of errors: ");
  lVar14 = *(long *)poVar9;
  *(undefined8 *)(poVar9 + *(long *)(lVar14 + -0x18) + 8) = 2;
  lVar14 = *(long *)(lVar14 + -0x18);
  *(uint *)(poVar9 + lVar14 + 0x18) = *(uint *)(poVar9 + lVar14 + 0x18) & 0xfffffefb | 4;
  poVar9 = std::ostream::_M_insert<double>(((double)iVar12 * 100.0) / (double)iVar21);
  std::operator<<(poVar9," %\n");
  poVar9 = std::operator<<((ostream *)&std::cout," | Maximum absolute error: ");
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 0x11;
  poVar9 = std::operator<<(poVar9,0x20);
  lVar14 = *(long *)poVar9;
  lVar11 = *(long *)(lVar14 + -0x18);
  *(uint *)(poVar9 + lVar11 + 0x18) = *(uint *)(poVar9 + lVar11 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar9 + *(long *)(lVar14 + -0x18) + 8) = 10;
  poVar9 = std::ostream::_M_insert<double>((double)local_58._0_8_);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<((ostream *)&std::cout," | Maximum relative error: ");
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 0x11;
  poVar9 = std::operator<<(poVar9,0x20);
  lVar14 = *(long *)poVar9;
  lVar11 = *(long *)(lVar14 + -0x18);
  *(uint *)(poVar9 + lVar11 + 0x18) = *(uint *)(poVar9 + lVar11 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar9 + *(long *)(lVar14 + -0x18) + 8) = 10;
  poVar9 = std::ostream::_M_insert<double>((double)local_58._8_8_);
  std::operator<<(poVar9,"\n");
  if (data1 != (float *)0x0) {
    operator_delete__(data1);
  }
  if (data2 != (float *)0x0) {
    operator_delete__(data2);
  }
  return;
}

Assistant:

void printDifference(const Serializer& serializer1, const Serializer& serializer2,
                     const Savepoint& savepoint,
                     const DataFieldInfo& info1, const DataFieldInfo& info2,
                     const IJKLBounds& bounds,
                     const vector<bool>& failed)
{
    T* data1;
    readData(serializer1, info1, savepoint, data1);

    T* data2;
    readData(serializer2, info2, savepoint, data2);

    int iSize = info1.iSize();
    int jSize = info1.jSize();
    int kSize = info1.kSize();
    int lSize = info1.lSize();

    int nValues = (bounds.iUpper - bounds.iLower + 1) * (bounds.jUpper - bounds.jLower + 1) *
                  (bounds.kUpper - bounds.kLower + 1) * (bounds.lUpper - bounds.lLower + 1);
    int nErrors = 0;
    unsigned int nNan = 0;

    double maxRelError = 0;
    double maxAbsError = 0;

    for (int i = bounds.iLower; i <= bounds.iUpper; ++i) {
        for (int j = bounds.jLower; j <= bounds.jUpper; ++j) {
            for (int k = bounds.kLower; k <= bounds.kUpper; ++k) {
                for (int l = bounds.lLower; l <= bounds.lUpper; ++l) {
                    int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;
                    if (failed[index]) {
                        ++nErrors;

                        const double val = static_cast<double>(data1[index]);
                        const double ref = static_cast<double>(data2[index]);

                        if ((val != val) || (ref != ref)) {
                            ++nNan;
                        }
                        maxAbsError = std::max(maxAbsError, std::fabs(val - ref));
                        maxRelError = std::max(maxRelError, std::fabs((val - ref) / ref));
                    }
                }
            }
        }
    }

    std::cout << " | Number of values: " << std::setw(6) << nValues << "\n";
    std::cout << " | Number of errors: " << std::setw(6) << nErrors << "\n";
    if (nNan > 0) std::cout << " | Number of NaN errors: " << std::setw(6) << nNan << "\n";
    std::cout << " | Percentuage of errors: " << std::setprecision(2) << std::fixed << (100.*nErrors) / nValues << " %\n";
    std::cout << " | Maximum absolute error: " << std::setw(17) << std::setfill(' ') << std::scientific << std::setprecision(10) << maxAbsError  << "\n";
    std::cout << " | Maximum relative error: " << std::setw(17) << std::setfill(' ') << std::scientific << std::setprecision(10) << maxRelError  << "\n";

    delete [] data1;
    delete [] data2;

}